

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Clara::Parser::parseIntoTokens
          (Parser *this,int argc,char **argv,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens)

{
  ulong uVar1;
  allocator local_51;
  string local_50;
  
  if (1 < argc) {
    uVar1 = 1;
    do {
      std::__cxx11::string::string((string *)&local_50,argv[uVar1],&local_51);
      parseIntoTokens(this,&local_50,tokens);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  return;
}

Assistant:

void parseIntoTokens( int argc, char const * const * argv, std::vector<Parser::Token>& tokens ) const {
            for( int i = 1; i < argc; ++i )
                parseIntoTokens( argv[i] , tokens);
        }